

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O3

vector<CScript,_std::allocator<CScript>_> * __thiscall
anon_unknown.dwarf_2a1200::MultisigDescriptor::MakeScripts
          (vector<CScript,_std::allocator<CScript>_> *__return_storage_ptr__,
          MultisigDescriptor *this,vector<CPubKey,_std::allocator<CPubKey>_> *keys,
          Span<const_CScript> param_2,FlatSigningProvider *param_3)

{
  long lVar1;
  pointer pCVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  vector<CPubKey,_std::allocator<CPubKey>_> sorted_keys;
  vector<CPubKey,_std::allocator<CPubKey>_> local_60;
  direct_or_indirect local_48;
  uint local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_sorted == true) {
    std::vector<CPubKey,_std::allocator<CPubKey>_>::vector(&local_60,keys);
    pCVar2 = local_60.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_60.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_60.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uVar3 = ((long)local_60.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)local_60.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                    super__Vector_impl_data._M_start) * 0xfc0fc0fc0fc0fc1;
      lVar1 = 0x3f;
      if (uVar3 != 0) {
        for (; uVar3 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<CPubKey*,std::vector<CPubKey,std::allocator<CPubKey>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_60.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_60.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                 super__Vector_impl_data._M_finish,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<CPubKey*,std::vector<CPubKey,std::allocator<CPubKey>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pCVar2,local_60.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                        super__Vector_impl_data._M_finish);
    }
    GetScriptForMultisig((CScript *)&local_48.indirect_contents,this->m_threshold,&local_60);
    (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<CScript,_std::allocator<CScript>_>::reserve(__return_storage_ptr__,1);
    std::vector<CScript,_std::allocator<CScript>_>::emplace_back<CScript>
              (__return_storage_ptr__,(CScript *)&local_48.indirect_contents);
    if (0x1c < local_2c) {
      free(local_48.indirect_contents.indirect);
    }
    if (local_60.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_60.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_60.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  else {
    GetScriptForMultisig((CScript *)&local_48.indirect_contents,this->m_threshold,keys);
    (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<CScript,_std::allocator<CScript>_>::reserve(__return_storage_ptr__,1);
    std::vector<CScript,_std::allocator<CScript>_>::emplace_back<CScript>
              (__return_storage_ptr__,(CScript *)&local_48.indirect_contents);
    if (0x1c < local_2c) {
      free(local_48.indirect_contents.indirect);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<CScript> MakeScripts(const std::vector<CPubKey>& keys, Span<const CScript>, FlatSigningProvider&) const override {
        if (m_sorted) {
            std::vector<CPubKey> sorted_keys(keys);
            std::sort(sorted_keys.begin(), sorted_keys.end());
            return Vector(GetScriptForMultisig(m_threshold, sorted_keys));
        }
        return Vector(GetScriptForMultisig(m_threshold, keys));
    }